

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_attribute::as_bool(xml_attribute *this,bool def)

{
  char_t *value_00;
  byte local_31;
  char_t *value;
  bool def_local;
  xml_attribute *this_local;
  
  this_local._7_1_ = def;
  if (this->_attr != (xml_attribute_struct *)0x0) {
    value_00 = this->_attr->value;
    local_31 = def;
    if (value_00 != (char_t *)0x0) {
      local_31 = impl::anon_unknown_0::get_value_bool(value_00);
    }
    this_local._7_1_ = local_31 & 1;
  }
  return (bool)this_local._7_1_;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::as_bool(bool def) const
	{
		if (!_attr) return def;
		const char_t* value = _attr->value;
		return value ? impl::get_value_bool(value) : def;
	}